

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDebug.cpp
# Opt level: O0

HighsStatus debugDebugToHighsStatus(HighsDebugStatus debug_status)

{
  HighsDebugStatus debug_status_local;
  undefined4 local_4;
  
  if ((uint)(debug_status + kSmallError) < 3) {
    local_4 = kOk;
  }
  else if ((uint)(debug_status + ~kSmallError) < 2) {
    local_4 = kWarning;
  }
  else if ((uint)(debug_status + ~kLargeError) < 3) {
    local_4 = kError;
  }
  else {
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus debugDebugToHighsStatus(const HighsDebugStatus debug_status) {
  switch (debug_status) {
    case HighsDebugStatus::kNotChecked:
    case HighsDebugStatus::kOk:
    case HighsDebugStatus::kSmallError:
      return HighsStatus::kOk;
    case HighsDebugStatus::kWarning:
    case HighsDebugStatus::kLargeError:
      return HighsStatus::kWarning;
    case HighsDebugStatus::kError:
    case HighsDebugStatus::kExcessiveError:
    case HighsDebugStatus::kLogicalError:
      return HighsStatus::kError;
    default:
      return HighsStatus::kOk;
  }
}